

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::get_subtrie(parameter_trie *this,char c)

{
  long lVar1;
  char cVar2;
  shared_count in_RDX;
  undefined7 in_register_00000031;
  long lVar3;
  long lVar4;
  parameter_trie_ptr pVar5;
  parameter_trie_ptr pVar6;
  
  lVar4 = *(long *)(CONCAT71(in_register_00000031,c) + 0x10);
  if (lVar4 != 0) {
    lVar3 = CONCAT71(in_register_00000031,c) + 8;
    lVar1 = lVar3;
    do {
      cVar2 = (char)in_RDX.pi_;
      if (cVar2 <= *(char *)(lVar4 + 0x20)) {
        lVar1 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(char *)(lVar4 + 0x20) < cVar2) * 8);
    } while (lVar4 != 0);
    if ((lVar1 != lVar3) && (*(char *)(lVar1 + 0x20) <= cVar2)) {
      in_RDX.pi_ = *(sp_counted_base **)(lVar1 + 0x28);
      *(sp_counted_base **)&(this->m_subtrie)._M_t._M_impl = in_RDX.pi_;
      lVar4 = *(long *)(lVar1 + 0x30);
      *(long *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = lVar4;
      if (lVar4 != 0) {
        LOCK();
        *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
        UNLOCK();
        pVar6.pn.pi_ = in_RDX.pi_;
        pVar6.px = this;
        return pVar6;
      }
      goto LAB_0018f965;
    }
  }
  *(undefined8 *)&(this->m_subtrie)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
LAB_0018f965:
  pVar5.pn.pi_ = in_RDX.pi_;
  pVar5.px = this;
  return pVar5;
}

Assistant:

parameter_trie_ptr  get_subtrie( char c ) const
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        return it != m_subtrie.end() ? it->second : parameter_trie_ptr();
    }